

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OricMFMDSK.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::OricMFMDSK::get_track_at_position(OricMFMDSK *this,Address address)

{
  _func_int *p_Var1;
  DiskImage DVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  Address in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  shared_ptr<Storage::Disk::Track> sVar11;
  uint8_t last_header [6];
  unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
  encoder;
  PCMSegment segment;
  byte local_b8 [8];
  DiskImage local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  FileHolder *local_a0;
  pthread_mutex_t *local_98;
  OricMFMDSK *local_90;
  PCMSegment local_88;
  
  local_88.length_of_a_bit.length = 1;
  local_88.length_of_a_bit.clock_rate = 1;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
  .super__Bit_iterator_base._M_offset = 0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_a0 = (FileHolder *)((long)address + 8);
  local_90 = this;
  local_98 = (pthread_mutex_t *)FileHolder::get_file_access_mutex(local_a0);
  iVar4 = pthread_mutex_lock(local_98);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  lVar6 = get_file_offset_for_position((OricMFMDSK *)address,in_RDX);
  FileHolder::seek(local_a0,lVar6,0);
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  Encodings::MFM::GetMFMEncoder
            ((MFM *)&local_b0,&local_88.data,(vector<bool,_std::allocator<bool>_> *)0x0);
  bVar10 = false;
  uVar8 = 0;
  do {
    bVar3 = FileHolder::get8(local_a0);
    uVar9 = uVar8 + 1;
    p_Var1 = *local_b0._vptr_DiskImage;
    if (bVar3 == 0xa1) {
      bVar10 = true;
      (**(code **)(p_Var1 + 0x40))(local_b0._vptr_DiskImage,0x4489,0);
    }
    else if (bVar3 == 0xc2) {
      (**(code **)(p_Var1 + 0x40))(local_b0._vptr_DiskImage,0x5224,0);
    }
    else {
      (**(code **)(p_Var1 + 0x18))(local_b0._vptr_DiskImage,(ulong)(uint)bVar3,0);
      if (bVar10) {
        if (bVar3 == 0xfb) {
          uVar5 = 0x80 << (local_b8[3] & 0x1f);
          if ((int)uVar5 < 0) goto LAB_0043d12e;
          uVar9 = (ulong)uVar5 + 3 + uVar8;
          lVar6 = 0;
          do {
            DVar2._vptr_DiskImage = local_b0._vptr_DiskImage;
            bVar3 = FileHolder::get8(local_a0);
            (**(code **)(*DVar2._vptr_DiskImage + 0x18))(DVar2._vptr_DiskImage,(ulong)bVar3,0);
            if (0x18fe - uVar8 == lVar6) {
              uVar9 = 0x1900;
              goto LAB_0043d12e;
            }
            lVar6 = lVar6 + 1;
            bVar10 = false;
          } while (uVar5 + 2 != (int)lVar6);
        }
        else {
          if (bVar3 != 0xfe) goto LAB_0043d12e;
          uVar9 = uVar8 + 7;
          lVar6 = 0;
          do {
            bVar3 = FileHolder::get8(local_a0);
            local_b8[lVar6] = bVar3;
            (**(code **)(*local_b0._vptr_DiskImage + 0x18))(local_b0._vptr_DiskImage,(ulong)bVar3,0)
            ;
            if (0x1868 - uVar8 == lVar6) {
              uVar9 = 0x186a;
              goto LAB_0043d12e;
            }
            lVar6 = lVar6 + 1;
            bVar10 = false;
          } while (lVar6 != 6);
        }
      }
      else {
LAB_0043d12e:
        bVar10 = false;
      }
    }
    uVar8 = uVar9;
    if (0x1869 < uVar9) {
      if (local_b0._vptr_DiskImage != (_func_int **)0x0) {
        (**(code **)(*local_b0._vptr_DiskImage + 8))();
      }
      pthread_mutex_unlock(local_98);
      local_b0._vptr_DiskImage = (_func_int **)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,Storage::Disk::PCMSegment&>
                (&local_a8,(PCMTrack **)&local_b0,(allocator<Storage::Disk::PCMTrack> *)local_b8,
                 &local_88);
      _Var7._M_pi = local_a8._M_pi;
      (local_90->super_DiskImage)._vptr_DiskImage = local_b0._vptr_DiskImage;
      (local_90->file_).file_ = (FILE *)0x0;
      local_a8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (local_90->file_).file_ = (FILE *)_Var7._M_pi;
      _Var7._M_pi = extraout_RDX;
      if (local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_end_of_storage -
                        (long)local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl
                              .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
        local_88.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
        _Var7._M_pi = extraout_RDX_00;
      }
      if (local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_88.data.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        _Var7._M_pi = extraout_RDX_01;
      }
      sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var7._M_pi;
      sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_90;
      return (shared_ptr<Storage::Disk::Track>)
             sVar11.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
    }
  } while( true );
}

Assistant:

std::shared_ptr<Track> OricMFMDSK::get_track_at_position(Track::Address address) {
	PCMSegment segment;
	{
		std::lock_guard lock_guard(file_.get_file_access_mutex());
		file_.seek(get_file_offset_for_position(address), SEEK_SET);

		// The file format omits clock bits. So it's not a genuine MFM capture.
		// A consumer must contextually guess when an FB, FC, etc is meant to be a control mark.
		std::size_t track_offset = 0;
		uint8_t last_header[6] = {0, 0, 0, 0, 0, 0};
		std::unique_ptr<Encodings::MFM::Encoder> encoder = Encodings::MFM::GetMFMEncoder(segment.data);
		bool did_sync = false;
		while(track_offset < 6250) {
			uint8_t next_byte = file_.get8();
			track_offset++;

			switch(next_byte) {
				default: {
					encoder->add_byte(next_byte);
					if(did_sync) {
						switch(next_byte) {
							default: break;

							case 0xfe:
								for(int byte = 0; byte < 6; byte++) {
									last_header[byte] = file_.get8();
									encoder->add_byte(last_header[byte]);
									++track_offset;
									if(track_offset == 6250) break;
								}
							break;

							case 0xfb:
								for(int byte = 0; byte < (128 << last_header[3]) + 2; byte++) {
									encoder->add_byte(file_.get8());
									++track_offset;
									// Special exception: don't interrupt a sector body if it seems to
									// be about to run over the end of the track. It seems like BD-500
									// disks break the usual 6250-byte rule, pushing out to just less
									// than 6400 bytes total.
									if(track_offset == 6400) break;
								}
							break;
						}
					}

					did_sync = false;
				}
				break;

				case 0xa1:	// a synchronisation mark that implies a sector or header coming
					encoder->output_short(Storage::Encodings::MFM::MFMSync);
					did_sync = true;
				break;

				case 0xc2:	// an 'ordinary' synchronisation mark
					encoder->output_short(Storage::Encodings::MFM::MFMIndexSync);
				break;
			}
		}
	}

	return std::make_shared<PCMTrack>(segment);
}